

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O3

void __thiscall qclab::qgates::CZ<double>::CZ(CZ<double> *this)

{
  PauliZ<double> *pPVar1;
  
  (this->super_QControlledGate2<double>).control_ = 0;
  (this->super_QControlledGate2<double>).controlState_ = 1;
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00135a68;
  pPVar1 = (PauliZ<double> *)operator_new(0x10);
  (pPVar1->super_QGate1<double>).qubit_ = 1;
  (pPVar1->super_QGate1<double>).super_QObject<double> = (QObject<double>)&PTR_nbQubits_00134d00;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<double>,_std::default_delete<qclab::qgates::PauliZ<double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<double>_*,_std::default_delete<qclab::qgates::PauliZ<double>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<double>_*,_false>._M_head_impl = pPVar1;
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }